

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec.c
# Opt level: O0

ram_addr_t find_ram_offset_last(uc_struct_conflict15 *uc,ram_addr_t size)

{
  ulong local_30;
  ulong local_28;
  ram_addr_t result;
  RAMBlock *block;
  ram_addr_t size_local;
  uc_struct_conflict15 *uc_local;
  
  local_28 = 0;
  for (result = (ram_addr_t)(uc->ram_list).blocks.lh_first; result != 0;
      result = *(ram_addr_t *)(result + 0x30)) {
    if (local_28 < (ulong)(*(long *)(result + 0x10) + *(long *)(result + 0x20))) {
      local_30 = *(long *)(result + 0x10) + *(long *)(result + 0x20);
    }
    else {
      local_30 = local_28;
    }
    local_28 = local_30;
  }
  return local_28;
}

Assistant:

static ram_addr_t find_ram_offset_last(struct uc_struct *uc, ram_addr_t size)
{
    RAMBlock *block;
    ram_addr_t result = 0;

    RAMBLOCK_FOREACH(block) {
        result = MAX(block->offset + block->max_length, result);
    }

    if (result + size > RAM_ADDR_MAX) {
        abort();
    }
    return result;
}